

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  MutexLock lock;
  MutexLock local_18;
  
  local_18.mu_ = &this->prototypes_mutex_;
  internal::Mutex::Lock(local_18.mu_);
  pMVar1 = GetPrototypeNoLock(this,type);
  internal::MutexLock::~MutexLock(&local_18);
  return pMVar1;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}